

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_clip.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  ALLEGRO_EVENT_QUEUE *pAVar4;
  undefined8 uVar5;
  char *ctx;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_install_mouse();
  al_init_font_addon();
  init_platform_specific();
  ctx = (char *)0x280;
  lVar2 = al_create_display(0x280,0x1e0);
  if (lVar2 == 0) {
    ctx = "Error creating display.\n";
    abort_example();
  }
  init((EVP_PKEY_CTX *)ctx);
  uVar3 = al_create_timer(1.0 / (double)ex.FPS);
  pAVar4 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  ex.queue = pAVar4;
  uVar5 = al_get_keyboard_event_source();
  al_register_event_source(pAVar4,uVar5);
  pAVar4 = ex.queue;
  uVar5 = al_get_mouse_event_source();
  al_register_event_source(pAVar4,uVar5);
  pAVar4 = ex.queue;
  uVar5 = al_get_display_event_source(lVar2);
  al_register_event_source(pAVar4,uVar5);
  pAVar4 = ex.queue;
  uVar5 = al_get_timer_event_source(uVar3);
  al_register_event_source(pAVar4,uVar5);
  al_start_timer(uVar3);
  run();
  al_destroy_event_queue(ex.queue);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}